

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O1

int mbedtls_dhm_parse_dhm(mbedtls_dhm_context *dhm,uchar *dhmin,size_t dhminlen)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uchar *end;
  uchar *p;
  size_t len;
  mbedtls_pem_context pem;
  mbedtls_mpi rec;
  uchar *local_70;
  size_t local_68;
  size_t local_60;
  mbedtls_pem_context local_58;
  mbedtls_mpi local_40;
  
  local_68 = dhminlen;
  mbedtls_pem_init(&local_58);
  iVar1 = -0x1080;
  if ((local_68 != 0) && (dhmin[local_68 - 1] == '\0')) {
    iVar1 = mbedtls_pem_read_buffer
                      (&local_58,"-----BEGIN DH PARAMETERS-----","-----END DH PARAMETERS-----",dhmin
                       ,(uchar *)0x0,0,&local_68);
  }
  if (iVar1 == 0) {
    local_68 = local_58.buflen;
  }
  else if (iVar1 != -0x1080) goto LAB_0011d72a;
  if (iVar1 == 0) {
    dhmin = local_58.buf;
  }
  local_70 = dhmin;
  iVar1 = mbedtls_asn1_get_tag(&local_70,dhmin + local_68,&local_60,0x30);
  if (iVar1 == 0) {
    end = local_70 + local_60;
    iVar1 = mbedtls_asn1_get_mpi(&local_70,end,&dhm->P);
    if ((iVar1 == 0) && (iVar1 = mbedtls_asn1_get_mpi(&local_70,end,&dhm->G), iVar1 == 0)) {
      if (local_70 != end) {
        mbedtls_mpi_init(&local_40);
        iVar1 = mbedtls_asn1_get_mpi(&local_70,end,&local_40);
        mbedtls_mpi_free(&local_40);
        if (iVar1 == 0) {
          iVar1 = -0x33e6;
          if (local_70 == end) {
            iVar1 = 0;
          }
          iVar2 = 6;
          if (local_70 == end) {
            iVar2 = 0;
          }
        }
        else {
          iVar1 = iVar1 + -0x3380;
          iVar2 = 6;
        }
        if (iVar2 == 6) goto LAB_0011d72a;
        if (iVar2 != 0) {
          return iVar1;
        }
      }
      sVar3 = mbedtls_mpi_size(&dhm->P);
      dhm->len = sVar3;
      iVar1 = 0;
      goto LAB_0011d72a;
    }
  }
  iVar1 = iVar1 + -0x3380;
LAB_0011d72a:
  mbedtls_pem_free(&local_58);
  if (iVar1 != 0) {
    mbedtls_dhm_free(dhm);
  }
  return iVar1;
}

Assistant:

int mbedtls_dhm_parse_dhm( mbedtls_dhm_context *dhm, const unsigned char *dhmin,
                   size_t dhminlen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;
    unsigned char *p, *end;
#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_context pem;
#endif /* MBEDTLS_PEM_PARSE_C */

    DHM_VALIDATE_RET( dhm != NULL );
    DHM_VALIDATE_RET( dhmin != NULL );

#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_init( &pem );

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( dhminlen == 0 || dhmin[dhminlen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN DH PARAMETERS-----",
                               "-----END DH PARAMETERS-----",
                               dhmin, NULL, 0, &dhminlen );

    if( ret == 0 )
    {
        /*
         * Was PEM encoded
         */
        dhminlen = pem.buflen;
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
        goto exit;

    p = ( ret == 0 ) ? pem.buf : (unsigned char *) dhmin;
#else
    p = (unsigned char *) dhmin;
#endif /* MBEDTLS_PEM_PARSE_C */
    end = p + dhminlen;

    /*
     *  DHParams ::= SEQUENCE {
     *      prime              INTEGER,  -- P
     *      generator          INTEGER,  -- g
     *      privateValueLength INTEGER OPTIONAL
     *  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        ret = MBEDTLS_ERR_DHM_INVALID_FORMAT + ret;
        goto exit;
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_mpi( &p, end, &dhm->P  ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &dhm->G ) ) != 0 )
    {
        ret = MBEDTLS_ERR_DHM_INVALID_FORMAT + ret;
        goto exit;
    }

    if( p != end )
    {
        /* This might be the optional privateValueLength.
         * If so, we can cleanly discard it */
        mbedtls_mpi rec;
        mbedtls_mpi_init( &rec );
        ret = mbedtls_asn1_get_mpi( &p, end, &rec );
        mbedtls_mpi_free( &rec );
        if ( ret != 0 )
        {
            ret = MBEDTLS_ERR_DHM_INVALID_FORMAT + ret;
            goto exit;
        }
        if ( p != end )
        {
            ret = MBEDTLS_ERR_DHM_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
            goto exit;
        }
    }

    ret = 0;

    dhm->len = mbedtls_mpi_size( &dhm->P );

exit:
#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_free( &pem );
#endif
    if( ret != 0 )
        mbedtls_dhm_free( dhm );

    return( ret );
}